

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle.cpp
# Opt level: O0

void __thiscall particle::collideBox(particle *this,vec2f *box,float *r)

{
  float fVar1;
  floatingType *pfVar2;
  float *in_RDX;
  vec2<float> *in_RSI;
  vec2<float> *in_RDI;
  floatingType local_20;
  floatingType local_1c;
  float *local_18;
  vec2<float> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pfVar2 = vec2<float>::getX(in_RDI);
  if ((*local_18 + 0.0 <= *pfVar2) ||
     (pfVar2 = vec2<float>::getX(in_RDI + 1), 0.0 < *pfVar2 || *pfVar2 == 0.0)) {
    pfVar2 = vec2<float>::getX(in_RDI);
    fVar1 = *pfVar2;
    pfVar2 = vec2<float>::getX(local_10);
    if ((fVar1 <= *pfVar2 - *local_18) || (pfVar2 = vec2<float>::getX(in_RDI + 1), *pfVar2 <= 0.0))
    goto LAB_00124d4d;
  }
  pfVar2 = vec2<float>::getX(in_RDI + 1);
  local_1c = -*pfVar2;
  vec2<float>::setX(in_RDI + 1,&local_1c);
LAB_00124d4d:
  pfVar2 = vec2<float>::getY(in_RDI);
  if ((*local_18 + 0.0 <= *pfVar2) ||
     (pfVar2 = vec2<float>::getY(in_RDI + 1), 0.0 < *pfVar2 || *pfVar2 == 0.0)) {
    pfVar2 = vec2<float>::getY(in_RDI);
    fVar1 = *pfVar2;
    pfVar2 = vec2<float>::getY(local_10);
    if (fVar1 <= *pfVar2 - *local_18) {
      return;
    }
    pfVar2 = vec2<float>::getY(in_RDI + 1);
    if (*pfVar2 <= 0.0) {
      return;
    }
  }
  pfVar2 = vec2<float>::getY(in_RDI + 1);
  local_20 = -*pfVar2;
  vec2<float>::setY(in_RDI + 1,&local_20);
  return;
}

Assistant:

void particle::collideBox(const vec2f& box, const float& r)
{
    if((position.getX() < 0 + r && velocity.getX() < 0)
       || (position.getX() > box.getX() - r && velocity.getX() > 0))
        velocity.setX(-velocity.getX());
    if((position.getY() < 0 + r && velocity.getY() < 0)
       || (position.getY() > box.getY() - r && velocity.getY() > 0))
        velocity.setY(-velocity.getY());
}